

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2test.c
# Opt level: O0

int callout_function(pcre2_callout_block_8 *cb,void *callout_data_ptr)

{
  uint utf_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint local_64;
  ulong local_60;
  FILE *local_50;
  uint local_44;
  int callout_data;
  uint32_t delimiter;
  FILE *f;
  BOOL callout_capture;
  BOOL utf;
  uint32_t subject_length;
  uint32_t post_start;
  uint32_t pre_start;
  uint32_t i;
  void *callout_data_ptr_local;
  pcre2_callout_block_8 *cb_local;
  
  utf_00 = (uint)((compiled_code8->overall_options & 0x80000) != 0);
  bVar4 = (dat_datctl.control & 0x40) != 0;
  if (((first_callout != 0) || (bVar4)) || (cb->callout_string != (PCRE2_SPTR8)0x0)) {
    local_50 = (FILE *)outfile;
  }
  else {
    local_50 = (FILE *)0x0;
  }
  if (cb->callout_string != (PCRE2_SPTR8)0x0) {
    local_44 = (uint)cb->callout_string[-1];
    fprintf((FILE *)outfile,"Callout (%lu): %c",cb->callout_string_offset,(ulong)local_44);
    pchars8(cb->callout_string,(int)cb->callout_string_length,utf_00,outfile);
    for (post_start = 0; callout_start_delims[post_start] != 0; post_start = post_start + 1) {
      if (local_44 == callout_start_delims[post_start]) {
        local_44 = callout_end_delims[post_start];
        break;
      }
    }
    fprintf((FILE *)outfile,"%c",(ulong)local_44);
    if (!bVar4) {
      fprintf((FILE *)outfile,"\n");
    }
  }
  if (bVar4) {
    if (cb->callout_string == (PCRE2_SPTR8)0x0) {
      fprintf((FILE *)outfile,"Callout %d:",(ulong)cb->callout_number);
    }
    fprintf((FILE *)outfile," last capture = %d\n",(ulong)cb->capture_last);
    for (post_start = 0; post_start < cb->capture_top << 1; post_start = post_start + 2) {
      fprintf((FILE *)outfile,"%2d: ",(ulong)(post_start >> 1));
      if (cb->offset_vector[post_start] == 0xffffffffffffffff) {
        fprintf((FILE *)outfile,"<unset>");
      }
      else {
        pchars8(cb->subject + cb->offset_vector[post_start],
                (int)cb->offset_vector[post_start + 1] - (int)cb->offset_vector[post_start],utf_00,
                (FILE *)local_50);
      }
      fprintf((FILE *)outfile,"\n");
    }
  }
  if (local_50 != (FILE *)0x0) {
    fprintf(local_50,"--->");
  }
  uVar1 = pchars8(cb->subject,(int)cb->start_match,utf_00,(FILE *)local_50);
  iVar2 = pchars8(cb->subject + cb->start_match,(int)cb->current_position - (int)cb->start_match,
                  utf_00,(FILE *)local_50);
  iVar3 = pchars8(cb->subject,(int)cb->subject_length,utf_00,(FILE *)0x0);
  pchars8(cb->subject + cb->current_position,(int)cb->subject_length - (int)cb->current_position,
          utf_00,(FILE *)local_50);
  if (local_50 != (FILE *)0x0) {
    fprintf(local_50,"\n");
  }
  if (cb->callout_number == 0xff) {
    fprintf((FILE *)outfile,"%+3d ",cb->pattern_position & 0xffffffff);
    if (99 < cb->pattern_position) {
      fprintf((FILE *)outfile,"\n    ");
    }
  }
  else if ((bVar4) || (cb->callout_string != (PCRE2_SPTR8)0x0)) {
    fprintf((FILE *)outfile,"    ");
  }
  else {
    fprintf((FILE *)outfile,"%3d ",(ulong)cb->callout_number);
  }
  for (post_start = 0; post_start < uVar1; post_start = post_start + 1) {
    fprintf((FILE *)outfile," ");
  }
  fprintf((FILE *)outfile,"^");
  if (iVar2 != 0) {
    for (post_start = 0; post_start < iVar2 - 1U; post_start = post_start + 1) {
      fprintf((FILE *)outfile," ");
    }
    fprintf((FILE *)outfile,"^");
  }
  for (post_start = 0; post_start < ((iVar3 - uVar1) - iVar2) + 4; post_start = post_start + 1) {
    fprintf((FILE *)outfile," ");
  }
  if (cb->next_item_length == 0) {
    local_60 = 1;
  }
  else {
    local_60 = cb->next_item_length;
  }
  fprintf((FILE *)outfile,"%.*s",local_60 & 0xffffffff,pbuffer8 + cb->pattern_position);
  fprintf((FILE *)outfile,"\n");
  first_callout = 0;
  if (cb->mark != (PCRE2_SPTR8)last_callout_mark) {
    if (cb->mark == (PCRE2_SPTR8)0x0) {
      fprintf((FILE *)outfile,"Latest Mark: <unset>\n");
    }
    else {
      fprintf((FILE *)outfile,"Latest Mark: ");
      pchars8(cb->mark,-1,utf_00,outfile);
      putc(10,(FILE *)outfile);
    }
    last_callout_mark = cb->mark;
  }
  if ((callout_data_ptr == (void *)0x0) || (cb_local._4_4_ = *callout_data_ptr, cb_local._4_4_ == 0)
     ) {
    if (cb->callout_number == dat_datctl.cfail[0]) {
      callout_count = callout_count + 1;
      local_64 = (uint)(dat_datctl.cfail[1] <= callout_count);
    }
    else {
      local_64 = 0;
    }
    cb_local._4_4_ = local_64;
  }
  else {
    fprintf((FILE *)outfile,"Callout data = %d\n",(ulong)cb_local._4_4_);
  }
  return cb_local._4_4_;
}

Assistant:

static int
callout_function(pcre2_callout_block_8 *cb, void *callout_data_ptr)
{
uint32_t i, pre_start, post_start, subject_length;
BOOL utf = (FLD(compiled_code, overall_options) & PCRE2_UTF) != 0;
BOOL callout_capture = (dat_datctl.control & CTL_CALLOUT_CAPTURE) != 0;

/* This FILE is used for echoing the subject. This is done only once in simple
cases. */

FILE *f = (first_callout || callout_capture || cb->callout_string != NULL)?
  outfile : NULL;

/* For a callout with a string argument, show the string first because there
isn't a tidy way to fit it in the rest of the data. */

if (cb->callout_string != NULL)
  {
  uint32_t delimiter = CODE_UNIT(cb->callout_string, -1);
  fprintf(outfile, "Callout (%lu): %c",
    (unsigned long int)cb->callout_string_offset, delimiter);
  PCHARSV(cb->callout_string, 0,
    cb->callout_string_length, utf, outfile);
  for (i = 0; callout_start_delims[i] != 0; i++)
    if (delimiter == callout_start_delims[i])
      {
      delimiter = callout_end_delims[i];
      break;
      }
  fprintf(outfile, "%c", delimiter);
  if (!callout_capture) fprintf(outfile, "\n");
  }

/* Show captured strings if required */

if (callout_capture)
  {
  if (cb->callout_string == NULL)
    fprintf(outfile, "Callout %d:", cb->callout_number);
  fprintf(outfile, " last capture = %d\n", cb->capture_last);
  for (i = 0; i < cb->capture_top * 2; i += 2)
    {
    fprintf(outfile, "%2d: ", i/2);
    if (cb->offset_vector[i] == PCRE2_UNSET)
      fprintf(outfile, "<unset>");
    else
      {
      PCHARSV(cb->subject, cb->offset_vector[i],
        cb->offset_vector[i+1] - cb->offset_vector[i], utf, f);
      }
    fprintf(outfile, "\n");
    }
  }

/* Re-print the subject in canonical form, the first time or if giving full
datails. On subsequent calls in the same match, we use pchars just to find the
printed lengths of the substrings. */

if (f != NULL) fprintf(f, "--->");

PCHARS(pre_start, cb->subject, 0, cb->start_match, utf, f);

PCHARS(post_start, cb->subject, cb->start_match,
  cb->current_position - cb->start_match, utf, f);

PCHARS(subject_length, cb->subject, 0, cb->subject_length, utf, NULL);

PCHARSV(cb->subject, cb->current_position,
  cb->subject_length - cb->current_position, utf, f);

if (f != NULL) fprintf(f, "\n");

/* For automatic callouts, show the pattern offset. Otherwise, for a numerical
callout whose number has not already been shown with captured strings, show the
number here. A callout with a string argument has been displayed above. */

if (cb->callout_number == 255)
  {
  fprintf(outfile, "%+3d ", (int)cb->pattern_position);
  if (cb->pattern_position > 99) fprintf(outfile, "\n    ");
  }
else
  {
  if (callout_capture || cb->callout_string != NULL) fprintf(outfile, "    ");
    else fprintf(outfile, "%3d ", cb->callout_number);
  }

/* Now show position indicators */

for (i = 0; i < pre_start; i++) fprintf(outfile, " ");
fprintf(outfile, "^");

if (post_start > 0)
  {
  for (i = 0; i < post_start - 1; i++) fprintf(outfile, " ");
  fprintf(outfile, "^");
  }

for (i = 0; i < subject_length - pre_start - post_start + 4; i++)
  fprintf(outfile, " ");

fprintf(outfile, "%.*s",
  (int)((cb->next_item_length == 0)? 1 : cb->next_item_length),
  pbuffer8 + cb->pattern_position);

fprintf(outfile, "\n");
first_callout = FALSE;

if (cb->mark != last_callout_mark)
  {
  if (cb->mark == NULL)
    fprintf(outfile, "Latest Mark: <unset>\n");
  else
    {
    fprintf(outfile, "Latest Mark: ");
    PCHARSV(cb->mark, 0, -1, utf, outfile);
    putc('\n', outfile);
    }
  last_callout_mark = cb->mark;
  }

if (callout_data_ptr != NULL)
  {
  int callout_data = *((int32_t *)callout_data_ptr);
  if (callout_data != 0)
    {
    fprintf(outfile, "Callout data = %d\n", callout_data);
    return callout_data;
    }
  }

return (cb->callout_number != dat_datctl.cfail[0])? 0 :
       (++callout_count >= dat_datctl.cfail[1])? 1 : 0;
}